

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::StringOption::~StringOption(StringOption *this)

{
  ~StringOption(this);
  operator_delete(this);
  return;
}

Assistant:

~StringOption()
    {
        if (value != NULL) {
            delete value;
        }
    }